

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastToDecimalCommaSeparated::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCastToDecimalCommaSeparated *this,string_t input,hugeint_t *result,
          CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  
  bVar1 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                    ((duckdb *)this,input,result,parameters,width,scale);
  return bVar1;
}

Assistant:

bool TryCastToDecimalCommaSeparated::Operation(string_t input, hugeint_t &result, CastParameters &parameters,
                                               uint8_t width, uint8_t scale) {
	return TryDecimalStringCast<hugeint_t, ','>(input, result, parameters, width, scale);
}